

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall
avro::NodeRecord::NodeRecord
          (NodeRecord *this,HasName *name,MultiLeaves *fields,LeafNames *fieldsNames,
          vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *dv)

{
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  reference pvVar2;
  Exception *this_01;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  ulong __n;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(&this->super_NodeImplRecord,AVRO_RECORD,name,fields,fieldsNames,
             (NoAttribute<int> *)&local_110);
  (this->super_NodeImplRecord).super_Node._vptr_Node = (_func_int **)&PTR__NodeRecord_001a2fa8;
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::vector
            (&this->defaultValues,dv);
  this_00 = &(this->super_NodeImplRecord).leafNameAttributes_;
  __n = 0;
  while( true ) {
    if ((ulong)((long)(this->super_NodeImplRecord).leafNameAttributes_.attrs_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_NodeImplRecord).leafNameAttributes_.attrs_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n) {
      return;
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this_00->attrs_,__n);
    bVar1 = concepts::
            NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::add(&(this->super_NodeImplRecord).nameIndex_,pvVar2,__n);
    if (!bVar1) break;
    __n = __n + 1;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_110,"Cannot add duplicate name: %1%");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this_00->attrs_,__n);
  msg = boost::io::detail::
        feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string&>
                  (&local_110,pvVar2);
  Exception::Exception(this_01,msg);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodeRecord(const HasName &name, const MultiLeaves &fields,
        const LeafNames &fieldsNames,
        const std::vector<GenericDatum>& dv) :
        NodeImplRecord(AVRO_RECORD, name, fields, fieldsNames, NoSize()),
        defaultValues(dv) { 
        for (size_t i = 0; i < leafNameAttributes_.size(); ++i) {
            if (!nameIndex_.add(leafNameAttributes_.get(i), i)) {
                throw Exception(boost::format(
                    "Cannot add duplicate name: %1%") %
                    leafNameAttributes_.get(i));
            }
        }
    }